

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v6::internal::
       parse_width<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  int width;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
  *in_RDX;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
  *in_RSI;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
  *in_RDI;
  char *in_stack_ffffffffffffffb8;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
  *in_stack_ffffffffffffffc0;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
  *psVar1;
  char *in_stack_ffffffffffffffc8;
  width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
  local_28 [2];
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
  *end_00;
  char *in_stack_fffffffffffffff8;
  
  if ((*(char *)&(in_RDI->
                 super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                 ).super_specs_setter<char>.specs_ < '0') ||
     ('9' < *(char *)&(in_RDI->
                      super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                      ).super_specs_setter<char>.specs_)) {
    if (*(char *)&(in_RDI->
                  super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                  ).super_specs_setter<char>.specs_ == '{') {
      psVar1 = (specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
                *)((long)&(in_RDI->
                          super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                          ).super_specs_setter<char>.specs_ + 1);
      in_RDI = psVar1;
      if (psVar1 != in_RSI) {
        end_00 = psVar1;
        width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
        ::width_adapter(local_28,in_RDX);
        in_RDI = (specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
                  *)parse_arg_id<char,fmt::v6::internal::width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&,char>>
                              (in_stack_fffffffffffffff8,(char *)end_00,
                               (width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
                                *)in_RSI);
        in_stack_ffffffffffffffc0 = psVar1;
      }
      if ((in_RDI == in_RSI) ||
         (*(char *)&(in_RDI->
                    super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                    ).super_specs_setter<char>.specs_ != '}')) {
        specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
        ::on_error(&in_stack_ffffffffffffffc0->
                    super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                   ,in_stack_ffffffffffffffb8);
      }
      else {
        in_RDI = (specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
                  *)((long)&(in_RDI->
                            super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                            ).super_specs_setter<char>.specs_ + 1);
      }
    }
  }
  else {
    width = parse_nonnegative_int<char,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&>
                      ((char **)in_RDX,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    specs_setter<char>::on_width((specs_setter<char> *)in_RDX,width);
  }
  return (char *)in_RDI;
}

Assistant:

FMT_CONSTEXPR const Char* parse_width(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}